

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O2

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object_object.cpp:330:68)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_object_object_cpp:330:68)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  pointer pvVar1;
  uint __line;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  property_attribute a;
  value *pvVar5;
  void *pvVar6;
  long *plVar7;
  object *this_00;
  undefined8 *puVar8;
  long *plVar9;
  anon_class_16_1_570cf4e1_for_f *this_01;
  gc_heap_ptr_untyped *this_02;
  char *__assertion;
  gc_heap *this_03;
  wstring_view wVar10;
  __type_identity_t<basic_string_view<wchar_t,_char_traits<wchar_t>_>_> __y;
  __type_identity_t<basic_string_view<wchar_t,_char_traits<wchar_t>_>_> __y_00;
  __type_identity_t<basic_string_view<wchar_t,_char_traits<wchar_t>_>_> __y_01;
  __type_identity_t<basic_string_view<wchar_t,_char_traits<wchar_t>_>_> __y_02;
  __type_identity_t<basic_string_view<wchar_t,_char_traits<wchar_t>_>_> __y_03;
  vector<mjs::string,_std::allocator<mjs::string>_> local_c8;
  object_ptr desc;
  undefined1 local_98 [40];
  undefined1 local_70 [16];
  string p;
  object_ptr o;
  wstring_view local_40;
  
  this_01 = &this->f;
  pvVar5 = (value *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_01);
  global_object::validate_object((global_object *)&o,pvVar5);
  pvVar6 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_01);
  pvVar1 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((int)(((long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pvVar1) / 0x28) < 2) {
    pvVar5 = (value *)&value::undefined;
  }
  else {
    pvVar5 = pvVar1 + 1;
  }
  to_string((mjs *)&p,*(gc_heap **)((long)pvVar6 + 8),pvVar5);
  plVar7 = (long *)gc_heap_ptr_untyped::get(&o.super_gc_heap_ptr_untyped);
  local_98._0_16_ = (undefined1  [16])string::view(&p);
  a = (**(code **)(*plVar7 + 0x30))(plVar7);
  bVar4 = is_valid(a);
  if (!bVar4) {
    value::value(__return_storage_ptr__,(value *)&value::undefined);
    goto LAB_0014924e;
  }
  gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_01);
  global_object::make_object((global_object *)&desc);
  bVar4 = has_attributes(a,accessor);
  if (bVar4) {
    pvVar6 = gc_heap_ptr_untyped::get(&o.super_gc_heap_ptr_untyped);
    wVar10 = string::view(&p);
    wVar10._M_str = (wchar_t *)wVar10._M_len;
    wVar10._M_len = (size_t)pvVar6;
    object::get_accessor_property_object((object *)local_70,wVar10);
    if ((desc.super_gc_heap_ptr_untyped.heap_ != (gc_heap *)0x0) &&
       ((gc_heap *)local_70._0_8_ != (gc_heap *)0x0)) {
      gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_70);
      object::class_name((object *)local_98);
      wVar10 = string::view((string *)local_98);
      __y._M_str = L"Accessor";
      __y._M_len = 8;
      bVar4 = std::operator==(wVar10,__y);
      if (bVar4) {
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_98);
        this_00 = (object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_70);
        object::own_property_names(&local_c8,this_00,false);
        if ((long)local_c8.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_c8.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
                  super__Vector_impl_data._M_start != 0x30) {
          __assertion = "names.size() == 3";
          __line = 0x4b;
          goto LAB_001492c5;
        }
        for (this_03 = (gc_heap *)
                       local_c8.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            this_03 !=
            (gc_heap *)
            local_c8.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
            super__Vector_impl_data._M_finish; this_03 = (gc_heap *)&this_03->alloc_context_) {
          wVar10 = string::view((string *)this_03);
          __y_00._M_str = L"get";
          __y_00._M_len = 3;
          bVar4 = std::operator==(wVar10,__y_00);
          if (!bVar4) {
            wVar10 = string::view((string *)this_03);
            __y_01._M_str = L"set";
            __y_01._M_len = 3;
            bVar4 = std::operator==(wVar10,__y_01);
            if (!bVar4) {
              wVar10 = string::view((string *)this_03);
              __y_02._M_str = L"__strict__";
              __y_02._M_len = 10;
              bVar4 = std::operator==(wVar10,__y_02);
              if (!bVar4) {
                __assertion = 
                "p.view() == L\"get\" || p.view() == L\"set\" || p.view() == L\"__strict__\"";
                __line = 0x4d;
                goto LAB_001492c5;
              }
            }
          }
          wVar10 = string::view((string *)this_03);
          __y_03._M_str = L"__strict__";
          __y_03._M_len = 10;
          bVar4 = std::operator==(wVar10,__y_03);
          if (!bVar4) {
            plVar7 = (long *)gc_heap_ptr_untyped::get(&desc.super_gc_heap_ptr_untyped);
            puVar8 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_70);
            local_40 = string::view((string *)this_03);
            (**(code **)*puVar8)((value *)local_98,puVar8,&local_40);
            (**(code **)(*plVar7 + 8))(plVar7,this_03,(value *)local_98,0);
            value::~value((value *)local_98);
          }
        }
        std::vector<mjs::string,_std::allocator<mjs::string>_>::~vector(&local_c8);
        this_02 = (gc_heap_ptr_untyped *)local_70;
        goto LAB_00149162;
      }
    }
    __assertion = "dst && src && src->class_name().view() == L\"Accessor\"";
    __line = 0x49;
LAB_001492c5:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object_object.cpp"
                  ,__line,
                  "void mjs::(anonymous namespace)::copy_accessor_methods(const object_ptr &, const object_ptr &)"
                 );
  }
  plVar7 = (long *)gc_heap_ptr_untyped::get(&desc.super_gc_heap_ptr_untyped);
  plVar9 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_01);
  (**(code **)(*plVar9 + 0x98))(&local_c8,plVar9,"value");
  puVar8 = (undefined8 *)gc_heap_ptr_untyped::get(&o.super_gc_heap_ptr_untyped);
  local_40 = string::view(&p);
  (**(code **)*puVar8)(local_98,puVar8,&local_40);
  (**(code **)(*plVar7 + 8))(plVar7,&local_c8,local_98,0);
  value::~value((value *)local_98);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_c8);
  plVar7 = (long *)gc_heap_ptr_untyped::get(&desc.super_gc_heap_ptr_untyped);
  plVar9 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_01);
  (**(code **)(*plVar9 + 0x98))(&local_c8,plVar9,"writable");
  auVar2 = local_98._0_16_;
  local_98._0_4_ = 2;
  auVar3 = local_98._0_16_;
  local_98._9_7_ = auVar2._9_7_;
  local_98._0_8_ = auVar3._0_8_;
  local_98[8] = ~(byte)a & 1;
  (**(code **)(*plVar7 + 8))(plVar7,&local_c8,local_98,0);
  value::~value((value *)local_98);
  this_02 = (gc_heap_ptr_untyped *)&local_c8;
LAB_00149162:
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(this_02);
  plVar7 = (long *)gc_heap_ptr_untyped::get(&desc.super_gc_heap_ptr_untyped);
  plVar9 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_01);
  (**(code **)(*plVar9 + 0x98))(&local_c8,plVar9,"enumerable");
  auVar2 = local_98._0_16_;
  local_98._0_4_ = 2;
  auVar3 = local_98._0_16_;
  local_98._9_7_ = auVar2._9_7_;
  local_98._0_8_ = auVar3._0_8_;
  local_98[8] = (a & dont_enum) == none;
  (**(code **)(*plVar7 + 8))(plVar7,&local_c8,local_98,0);
  value::~value((value *)local_98);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_c8);
  plVar7 = (long *)gc_heap_ptr_untyped::get(&desc.super_gc_heap_ptr_untyped);
  plVar9 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_01);
  (**(code **)(*plVar9 + 0x98))(&local_c8,plVar9,"configurable");
  auVar2 = local_98._0_16_;
  local_98._0_4_ = 2;
  auVar3 = local_98._0_16_;
  local_98._9_7_ = auVar2._9_7_;
  local_98._0_8_ = auVar3._0_8_;
  local_98[8] = (a & dont_delete) == none;
  (**(code **)(*plVar7 + 8))(plVar7,&local_c8,local_98,0);
  value::~value((value *)local_98);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_c8);
  value::value(__return_storage_ptr__,&desc);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&desc.super_gc_heap_ptr_untyped);
LAB_0014924e:
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&p);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&o.super_gc_heap_ptr_untyped);
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }